

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O0

void __thiscall
ylt::metric::thread_local_value<long>::~thread_local_value(thread_local_value<long> *this)

{
  bool bVar1;
  iterator this_00;
  reference this_01;
  __pointer_type paVar2;
  __normal_iterator<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
  *in_RDI;
  atomic<std::atomic<long>_*> *t;
  iterator __end0;
  iterator __begin0;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *__range3;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (atomic<std::atomic<long>_*> *)
       std::
       vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  this_00 = std::
            vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
            ::end(in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
                           (in_RDI,(__normal_iterator<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
                                    *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
              ::operator*(local_18);
    paVar2 = std::atomic::operator_cast_to_atomic_((atomic<std::atomic<long>_*> *)0x1aba96);
    if ((paVar2 != (__pointer_type)0x0) &&
       (in_stack_ffffffffffffffc8 =
             (vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
              *)std::atomic<std::atomic<long>_*>::load
                          (this_01,(memory_order)((ulong)in_RDI >> 0x20)),
       in_stack_ffffffffffffffc8 !=
       (vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
        *)0x0)) {
      operator_delete(in_stack_ffffffffffffffc8,8);
    }
    __gnu_cxx::
    __normal_iterator<std::atomic<std::atomic<long>_*>_*,_std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>_>
    ::operator++(local_18);
  }
  std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  ::~vector((vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
             *)this_00._M_current);
  return;
}

Assistant:

~thread_local_value() {
    for (auto &t : duplicates_) {
      if (t) {
        delete t.load();
      }
    }
  }